

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string_view __thiscall slang::parsing::Token::valueText(Token *this)

{
  bool bVar1;
  string_view *psVar2;
  const_reference pvVar3;
  short *in_RDI;
  string_view sVar4;
  string_view result;
  Token *local_28;
  
  if (*in_RDI == 2) {
    sVar4 = rawText(local_28);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0)
    ;
    if ((!bVar1) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xfffffffffffffff0,0), *pvVar3 == '\\')) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)sVar4._M_len,
                         (size_type)in_RDI,(size_type)local_28);
    }
  }
  else if (*in_RDI == 4) {
    psVar2 = Info::stringText((Info *)0x2a2530);
    sVar4 = *psVar2;
  }
  else {
    sVar4 = rawText(local_28);
  }
  return sVar4;
}

Assistant:

std::string_view Token::valueText() const {
    switch (kind) {
        case TokenKind::StringLiteral:
            return info->stringText();
        case TokenKind::Identifier: {
            std::string_view result = rawText();
            if (!result.empty() && result[0] == '\\')
                result = result.substr(1);
            return result;
        }
        default:
            return rawText();
    }
}